

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_preserve_env(void)

{
  int iVar1;
  int iVar2;
  uv_pid_t uVar3;
  int extraout_EAX;
  uv_loop_t *puVar4;
  uv_stdio_container_t stdio [2];
  uv_pipe_t out;
  uv_stdio_container_t local_138;
  undefined4 local_128;
  uv_pipe_t *local_120;
  uv_pipe_t local_110;
  
  init_process_options("spawn_helper7",exit_cb);
  puVar4 = uv_default_loop();
  uv_pipe_init(puVar4,&local_110,0);
  local_138.flags = UV_IGNORE;
  local_128 = 0x21;
  options.stdio_count = 2;
  options.stdio = &local_138;
  local_120 = &local_110;
  iVar1 = putenv("ENV_TEST=testval");
  if (iVar1 == 0) {
    options.env = (char **)0x0;
    puVar4 = uv_default_loop();
    iVar1 = uv_spawn(puVar4,&process,&options);
    if (iVar1 != 0) goto LAB_0016b24d;
    iVar1 = uv_read_start((uv_stream_t *)&local_110,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_0016b252;
    puVar4 = uv_default_loop();
    iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016b257;
    if (exit_cb_called != 1) goto LAB_0016b25c;
    if (close_cb_called != 2) goto LAB_0016b261;
    printf("output is: %s",output);
    if (output._0_8_ != 0x6c617674736574) goto LAB_0016b266;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_preserve_env_cold_1();
LAB_0016b24d:
    run_test_spawn_preserve_env_cold_2();
LAB_0016b252:
    run_test_spawn_preserve_env_cold_3();
LAB_0016b257:
    run_test_spawn_preserve_env_cold_4();
LAB_0016b25c:
    run_test_spawn_preserve_env_cold_5();
LAB_0016b261:
    run_test_spawn_preserve_env_cold_6();
LAB_0016b266:
    run_test_spawn_preserve_env_cold_7();
  }
  run_test_spawn_preserve_env_cold_8();
  init_process_options("spawn_helper4",detach_failure_cb);
  options.flags._0_1_ = (byte)options.flags | 8;
  puVar4 = uv_default_loop();
  iVar1 = uv_spawn(puVar4,&process,&options);
  if (iVar1 == 0) {
    uv_unref((uv_handle_t *)&process);
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    iVar1 = process.pid;
    if (iVar2 != 0) goto LAB_0016b355;
    if (exit_cb_called != 0) goto LAB_0016b35a;
    uVar3 = uv_process_get_pid(&process);
    if (iVar1 != uVar3) goto LAB_0016b35f;
    iVar1 = uv_kill(process.pid,0);
    if (iVar1 != 0) goto LAB_0016b364;
    iVar1 = uv_kill(process.pid,0xf);
    if (iVar1 == 0) {
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016b36e;
    }
  }
  else {
    run_test_spawn_detached_cold_1();
LAB_0016b355:
    run_test_spawn_detached_cold_2();
LAB_0016b35a:
    run_test_spawn_detached_cold_3();
LAB_0016b35f:
    run_test_spawn_detached_cold_4();
LAB_0016b364:
    run_test_spawn_detached_cold_5();
  }
  run_test_spawn_detached_cold_6();
LAB_0016b36e:
  run_test_spawn_detached_cold_7();
  puts("detach_cb");
  exit_cb_called = exit_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_preserve_env) {
  int r;
  uv_pipe_t out;
  uv_stdio_container_t stdio[2];

  init_process_options("spawn_helper7", exit_cb);

  uv_pipe_init(uv_default_loop(), &out, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = putenv("ENV_TEST=testval");
  ASSERT(r == 0);

  /* Explicitly set options.env to NULL to test for env clobbering. */
  options.env = NULL;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2);

  printf("output is: %s", output);
  ASSERT(strcmp("testval", output) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}